

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

bool __thiscall qpdf::Tokenizer::getToken(Tokenizer *this,Token *token,bool *unread_char,char *ch)

{
  token_type_e tVar1;
  bool bVar2;
  byte local_13a;
  string local_138;
  byte local_111;
  string local_110;
  byte local_ed;
  string local_e0;
  byte local_b9;
  string local_b8;
  Token local_98;
  byte local_29;
  char *pcStack_28;
  bool ready;
  char *ch_local;
  bool *unread_char_local;
  Token *token_local;
  Tokenizer *this_local;
  
  local_29 = this->state == st_token_ready;
  local_13a = 0;
  if ((this->in_token & 1U) == 0) {
    local_13a = this->before_token ^ 0xff;
  }
  *unread_char = (bool)(local_13a & 1);
  *ch = this->char_to_unread;
  if ((bool)local_29) {
    local_b9 = 0;
    local_ed = 0;
    local_111 = 0;
    bVar2 = false;
    pcStack_28 = ch;
    ch_local = unread_char;
    unread_char_local = (bool *)token;
    token_local = (Token *)this;
    if ((this->type == tt_name) || (this->type == tt_string)) {
      tVar1 = this->type;
      std::__cxx11::string::string((string *)&local_110,(string *)&this->raw_val);
      local_111 = 1;
      std::__cxx11::string::string((string *)&local_138,(string *)&this->error_message);
      bVar2 = true;
      QPDFTokenizer::Token::Token(&local_98,tVar1,&this->val,&local_110,&local_138);
    }
    else {
      tVar1 = this->type;
      std::__cxx11::string::string((string *)&local_b8,(string *)&this->raw_val);
      local_b9 = 1;
      std::__cxx11::string::string((string *)&local_e0,(string *)&this->error_message);
      local_ed = 1;
      QPDFTokenizer::Token::Token(&local_98,tVar1,&this->raw_val,&local_b8,&local_e0);
    }
    QPDFTokenizer::Token::operator=((Token *)unread_char_local,&local_98);
    QPDFTokenizer::Token::~Token(&local_98);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_138);
    }
    if ((local_111 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_110);
    }
    if ((local_ed & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    if ((local_b9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    reset(this);
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool
Tokenizer::getToken(Token& token, bool& unread_char, char& ch)
{
    bool ready = (state == st_token_ready);
    unread_char = !in_token && !before_token;
    ch = char_to_unread;
    if (ready) {
        token = (!(type == tt::tt_name || type == tt::tt_string))
            ? Token(type, raw_val, raw_val, error_message)
            : Token(type, val, raw_val, error_message);

        reset();
    }
    return ready;
}